

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testJacobiTiming<double>(void)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  clock_t cVar4;
  clock_t cVar5;
  int iVar6;
  Matrix33<double> U;
  Vec3<double> S;
  Matrix33<double> V;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  Vec3 local_d0 [32];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_1d8 = 0x3ff0000000000000;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  local_b0 = 0x3ff0000000000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0x3ff0000000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_70 = 0x3ff0000000000000;
  local_150 = 0x3ff0000000000000;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0x3ff0000000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  local_110 = 0x3ff0000000000000;
  iVar6 = 100000;
  cVar1 = clock();
  do {
    local_1d8 = 0x3ff0000000000000;
    uStack_1c0 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1b8 = 0x3ddb7cdfd9d7bdbb;
    local_1a0 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    local_198 = 0x4202a05f20000000;
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33 *)&local_1d8,local_d0,(Matrix33 *)&local_b0,2.220446049250313e-16);
    local_1d8 = 0x3fd0099dce81e79d;
    uStack_1d0 = 0x3fdfa22842fd381c;
    uStack_1c8 = 0x3fea0d937ed653c1;
    uStack_1c0 = 0x3fdfa22842fd381c;
    uStack_1b8 = 0x3fe9a95c3326d625;
    uStack_1b0 = 0xbfe3bc696902b6d2;
    uStack_1a8 = 0x3fea0d937ed653c1;
    local_1a0 = 0xbfe3bc696902b6d2;
    local_198 = 0xbff48ecafb1e7296;
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33 *)&local_1d8,local_d0,(Matrix33 *)&local_b0,2.220446049250313e-16);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  cVar2 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Jacobi EigenSolver of 3x3 matrices took ",0x28);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," clocks.",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar6 = 100000;
  cVar4 = clock();
  do {
    local_1d8 = 0x3ff0000000000000;
    uStack_1c0 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1b8 = 0x3ddb7cdfd9d7bdbb;
    local_1a0 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    local_198 = 0x4202a05f20000000;
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_1d8,(Matrix33 *)&local_150,local_d0,(Matrix33 *)&local_b0,
               2.220446049250313e-16,false);
    local_1d8 = 0x3fd0099dce81e79d;
    uStack_1d0 = 0x3fdfa22842fd381c;
    uStack_1c8 = 0x3fea0d937ed653c1;
    uStack_1c0 = 0x3fdfa22842fd381c;
    uStack_1b8 = 0x3fe9a95c3326d625;
    uStack_1b0 = 0xbfe3bc696902b6d2;
    uStack_1a8 = 0x3fea0d937ed653c1;
    local_1a0 = 0xbfe3bc696902b6d2;
    local_198 = 0xbff48ecafb1e7296;
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_1d8,(Matrix33 *)&local_150,local_d0,(Matrix33 *)&local_b0,
               2.220446049250313e-16,false);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  cVar5 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TinySVD            of 3x3 matrices took ",0x28);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," clocks.",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>
                     ((double)(((float)((cVar5 - cVar4) - (cVar2 - cVar1)) * 100.0) /
                              (float)(cVar5 - cVar4)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% speed up.",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_1d8 = 0x3ff0000000000000;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0x3ff0000000000000;
  uStack_1a8 = 0;
  local_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0x3ff0000000000000;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  local_160 = 0x3ff0000000000000;
  local_b0 = 0x3ff0000000000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0x3ff0000000000000;
  uStack_80 = 0;
  local_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0x3ff0000000000000;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0x3ff0000000000000;
  local_150 = 0x3ff0000000000000;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_118 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 0x3ff0000000000000;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0x3ff0000000000000;
  iVar6 = 100000;
  cVar1 = clock();
  do {
    local_1d8 = 0x3ff0000000000000;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1b0 = 0x3bc79ca10c924223;
    uStack_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_1a8 = 0;
    local_1a0 = 0;
    uStack_168 = 0;
    local_160 = 0x4415af1d78b58c40;
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix44 *)&local_1d8,(Vec4 *)local_d0,(Matrix44 *)&local_b0,2.220446049250313e-16);
    local_1d8 = 0x40103adb123b91f3;
    uStack_1d0 = 0x3fc4f03ad22b10c6;
    uStack_1c8 = 0x3fbd8c01579ecd37;
    uStack_1c0 = 0xbffa7585fd17b857;
    uStack_1b8 = 0x3fc4f03ad22b10c6;
    uStack_1b0 = 0x3fe271091ea26319;
    uStack_1a8 = 0x400f155bddbc82d1;
    local_1a0 = 0x3fed71fa03e4a85f;
    local_198 = 0x3fbd8c01579ecd37;
    uStack_190 = 0x400f155bddbc82d1;
    local_188 = 0x3fe4eade09e98744;
    uStack_180 = 0xbfcc1f7dba046a5d;
    uStack_178 = 0xbffa7585fd17b857;
    uStack_170 = 0x3fed71fa03e4a85f;
    uStack_168 = 0xbfcc1f7dba046a5d;
    local_160 = 0xbfd1fd5bbbcdb3c4;
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix44 *)&local_1d8,(Vec4 *)local_d0,(Matrix44 *)&local_b0,2.220446049250313e-16);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  cVar2 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Jacobi EigenSolver of 4x4 matrices took ",0x28);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," clocks",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar6 = 100000;
  cVar4 = clock();
  do {
    local_1d8 = 0x3ff0000000000000;
    uStack_1c0 = 0;
    uStack_1b8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1b0 = 0x3bc79ca10c924223;
    uStack_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    uStack_1a8 = 0;
    local_1a0 = 0;
    uStack_168 = 0;
    local_160 = 0x4415af1d78b58c40;
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_1d8,(Matrix44 *)&local_150,(Vec4 *)local_d0,(Matrix44 *)&local_b0,
               2.220446049250313e-16,false);
    local_1d8 = 0x40103adb123b91f3;
    uStack_1d0 = 0x3fc4f03ad22b10c6;
    uStack_1c8 = 0x3fbd8c01579ecd37;
    uStack_1c0 = 0xbffa7585fd17b857;
    uStack_1b8 = 0x3fc4f03ad22b10c6;
    uStack_1b0 = 0x3fe271091ea26319;
    uStack_1a8 = 0x400f155bddbc82d1;
    local_1a0 = 0x3fed71fa03e4a85f;
    local_198 = 0x3fbd8c01579ecd37;
    uStack_190 = 0x400f155bddbc82d1;
    local_188 = 0x3fe4eade09e98744;
    uStack_180 = 0xbfcc1f7dba046a5d;
    uStack_178 = 0xbffa7585fd17b857;
    uStack_170 = 0x3fed71fa03e4a85f;
    uStack_168 = 0xbfcc1f7dba046a5d;
    local_160 = 0xbfd1fd5bbbcdb3c4;
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_1d8,(Matrix44 *)&local_150,(Vec4 *)local_d0,(Matrix44 *)&local_b0,
               2.220446049250313e-16,false);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  cVar5 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TinySVD            of 4x4 matrices took ",0x28);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," clocks",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>
                     ((double)(((float)((cVar5 - cVar4) - (cVar2 - cVar1)) * 100.0) /
                              (float)(cVar5 - cVar4)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% speed up.",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void
testJacobiTiming ()
{

    int     rounds (100000);
    clock_t tJacobi, tSVD, t;

    {
        Matrix33<T> A, V, U;
        Vec3<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix33<T> (A33_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 3x3 matrices took " << tJacobi
             << " clocks." << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiSVD (A, U, S, V);
            A = Matrix33<T> (A33_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 3x3 matrices took " << tSVD << " clocks."
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }

    {
        Matrix44<T> A, V, U;
        Vec4<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix44<T> (A44_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 4x4 matrices took " << tJacobi
             << " clocks" << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiSVD (A, U, S, V);
            A = Matrix44<T> (A44_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 4x4 matrices took " << tSVD << " clocks"
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }
}